

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall Catch::TestRegistry::registerTest(TestRegistry *this,TestCase *testCase)

{
  pointer pcVar1;
  int iVar2;
  TestCase local_2f8;
  ostringstream local_1e0 [8];
  ostringstream oss;
  ios_base local_170 [264];
  size_type *local_68;
  string name;
  undefined1 local_38 [16];
  
  pcVar1 = (testCase->super_TestCaseInfo).name._M_dataplus._M_p;
  local_68 = &name._M_string_length;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_68,pcVar1,
             pcVar1 + (testCase->super_TestCaseInfo).name._M_string_length);
  iVar2 = std::__cxx11::string::compare((char *)&local_68);
  if (iVar2 == 0) {
    std::__cxx11::ostringstream::ostringstream(local_1e0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1e0,"Anonymous test case ",0x14);
    this->m_unnamedCount = this->m_unnamedCount + 1;
    std::ostream::_M_insert<unsigned_long>((ulong)local_1e0);
    std::__cxx11::stringbuf::str();
    TestCase::withName(&local_2f8,testCase,(string *)((long)&name.field_2 + 8));
    (*(this->super_ITestCaseRegistry)._vptr_ITestCaseRegistry[4])(this,&local_2f8);
    TestCase::~TestCase(&local_2f8);
    if ((undefined1 *)name.field_2._8_8_ != local_38) {
      operator_delete((void *)name.field_2._8_8_);
    }
    std::__cxx11::ostringstream::~ostringstream(local_1e0);
    std::ios_base::~ios_base(local_170);
  }
  else {
    std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::push_back
              (&this->m_functions,testCase);
  }
  if (local_68 != &name._M_string_length) {
    operator_delete(local_68);
  }
  return;
}

Assistant:

virtual void registerTest(TestCase const& testCase) {
			std::string name = testCase.getTestCaseInfo().name;
			if (name == "") {
				std::ostringstream oss;
				oss << "Anonymous test case " << ++m_unnamedCount;
				return registerTest(testCase.withName(oss.str()));
			}
			m_functions.push_back(testCase);
		}